

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::SetStaticResourcesInitialized
          (ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *this)

{
  Char *Message;
  char (*in_RCX) [31];
  undefined1 local_30 [8];
  string msg;
  ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *this_local;
  
  if ((this->m_bStaticResourcesInitialized & 1U) != 0) {
    msg.field_2._8_8_ = this;
    FormatString<char[26],char[31]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!m_bStaticResourcesInitialized",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SetStaticResourcesInitialized",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
               ,0xaf);
    std::__cxx11::string::~string((string *)local_30);
  }
  this->m_bStaticResourcesInitialized = true;
  return;
}

Assistant:

void SetStaticResourcesInitialized()
    {
        VERIFY_EXPR(!m_bStaticResourcesInitialized);
        m_bStaticResourcesInitialized = true;
    }